

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldName
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  string local_30;
  
  if (this->use_field_number_ == true) {
    SimpleItoa_abi_cxx11_(&local_30,(protobuf *)(ulong)*(uint *)(field + 0x38),(int)reflection);
    TextGenerator::Print(generator,local_30._M_dataplus._M_p,local_30._M_string_length);
  }
  else {
    p_Var1 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var1->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0;
        p_Var3 = (&p_Var3->_M_left)[*(FieldDescriptor **)(p_Var3 + 1) < field]) {
      if (*(FieldDescriptor **)(p_Var3 + 1) >= field) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
       (p_Var3 = p_Var2, field < *(FieldDescriptor **)(p_Var2 + 1))) {
      p_Var3 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 == p_Var1) {
      p_Var3 = (_Base_ptr)(this->default_field_value_printer_).ptr_;
    }
    else {
      p_Var3 = p_Var3[1]._M_parent;
    }
    (**(code **)(*(long *)p_Var3 + 0x60))(&local_30,p_Var3,message,reflection);
    TextGenerator::Print(generator,local_30._M_dataplus._M_p,local_30._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldName(const Message& message,
                                         const Reflection* reflection,
                                         const FieldDescriptor* field,
                                         TextGenerator& generator) const {
  // if use_field_number_ is true, prints field number instead
  // of field name.
  if (use_field_number_) {
    generator.Print(SimpleItoa(field->number()));
    return;
  }

  const FieldValuePrinter* printer = FindWithDefault(
      custom_printers_, field, default_field_value_printer_.get());
  generator.Print(printer->PrintFieldName(message, reflection, field));
}